

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,ostream *ostr,string *makeCommandCSTR,string *config,cmBuildOptions *buildOptions
          ,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmake *this_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  char *__s;
  long lVar7;
  int iVar8;
  GeneratedMakeCommand *this_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view separator;
  int retVal;
  OutputOption local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  char *local_148;
  undefined8 local_140;
  string outputMakeCommandStr;
  string outputBuffer;
  string realConfig;
  string makeCommandStr;
  string buildOutput;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string local_78;
  cmWorkingDirectory workdir;
  
  bVar3 = cmSystemTools::s_RunCommandHideConsole;
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"Change Dir: \'",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (ostr,(bindir->_M_dataplus)._M_p,bindir->_M_string_length);
  local_168._M_dataplus._M_p._0_1_ = 0x27;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_168,1);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (workdir.ResultCode != 0) {
    cmSystemTools::s_RunCommandHideConsole = bVar3;
    __s = strerror(workdir.ResultCode);
    local_168._M_dataplus._M_p = &DAT_0000001c;
    local_168._M_string_length = 0x8168fd;
    local_168.field_2._M_allocated_capacity = 0;
    local_168.field_2._8_8_ = strlen(__s);
    local_140 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_168;
    local_148 = __s;
    cmCatViews(&realConfig,views);
    cmSystemTools::Error(&realConfig);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,realConfig._M_dataplus._M_p,realConfig._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)realConfig._M_dataplus._M_p != &realConfig.field_2) {
      operator_delete(realConfig._M_dataplus._M_p,realConfig.field_2._M_allocated_capacity + 1);
    }
    iVar8 = 1;
    goto LAB_002390a8;
  }
  realConfig._M_dataplus._M_p = (pointer)&realConfig.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&realConfig,pcVar2,pcVar2 + config->_M_string_length);
  if (realConfig._M_string_length == 0) {
    (*this->_vptr_cmGlobalGenerator[0x27])(&local_168,this);
    std::__cxx11::string::operator=((string *)&realConfig,(string *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  retVal = 0;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer._M_dataplus._M_p = (pointer)&outputBuffer.field_2;
  outputBuffer._M_string_length = 0;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  (*this->_vptr_cmGlobalGenerator[0x15])
            (&makeCommand,this,makeCommandCSTR,projectName,bindir,targets,&realConfig,
             (ulong)(uint)jobs,(ulong)verbose,buildOptions,nativeOptions);
  local_16c = outputflag;
  if (outputflag == OUTPUT_PASSTHROUGH) {
    local_16c = makeCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].super_GeneratedMakeCommand.
                RequiresOutputForward ^ OUTPUT_PASSTHROUGH;
  }
  if (buildOptions->Clean == true) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"clean","");
    __l._M_len = 1;
    __l._M_array = &local_168;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&outputMakeCommandStr,__l,(allocator_type *)&local_78);
    buildOutput._M_dataplus._M_p = (pointer)0x0;
    buildOutput._M_string_length = 0;
    buildOutput.field_2._M_allocated_capacity = 0;
    (*this->_vptr_cmGlobalGenerator[0x15])
              (&makeCommandStr,this,makeCommandCSTR,projectName,bindir,&outputMakeCommandStr,
               &realConfig,(ulong)(uint)jobs,(ulong)verbose,buildOptions,&buildOutput);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&buildOutput);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&outputMakeCommandStr);
    paVar1 = &local_168.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"\nRun Clean Command: ",0x14);
    detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_
              (&local_168,(GeneratedMakeCommand *)makeCommandStr._M_dataplus._M_p);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (ostr,local_168._M_dataplus._M_p,local_168._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar1) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if (makeCommandStr._M_string_length - (long)makeCommandStr._M_dataplus._M_p == 0x20) {
      bVar4 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)makeCommandStr._M_dataplus._M_p,&outputBuffer,&outputBuffer,&retVal,
                         (char *)0x0,local_16c,timeout,Auto);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (ostr,outputBuffer._M_dataplus._M_p,outputBuffer._M_string_length);
        std::
        vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                   *)&makeCommandStr);
        goto LAB_00238b38;
      }
      cmSystemTools::s_RunCommandHideConsole = bVar3;
      local_168._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"Generator: execution of make clean failed.","");
      cmSystemTools::Error(&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (ostr,outputBuffer._M_dataplus._M_p,outputBuffer._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\nGenerator: execution of make clean failed.",0x2b);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      this_00 = this->CMakeInstance;
      local_168._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,
                 "The generator did not produce exactly one command for the \'clean\' target","");
      outputMakeCommandStr._M_dataplus._M_p = (pointer)0x0;
      outputMakeCommandStr._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&outputMakeCommandStr);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&local_168,
                          (cmListFileBacktrace *)&outputMakeCommandStr);
      if (outputMakeCommandStr._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   outputMakeCommandStr._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector((vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               *)&makeCommandStr);
    iVar8 = 1;
  }
  else {
LAB_00238b38:
    makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
    makeCommandStr._M_string_length = 0;
    makeCommandStr.field_2._M_local_buf[0] = '\0';
    outputMakeCommandStr._M_dataplus._M_p = (pointer)&outputMakeCommandStr.field_2;
    outputMakeCommandStr._M_string_length = 0;
    outputMakeCommandStr.field_2._M_local_buf[0] = '\0';
    bVar4 = cmState::UseWatcomWMake
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    buildOutput._M_dataplus._M_p = (pointer)&buildOutput.field_2;
    buildOutput._M_string_length = 0;
    buildOutput.field_2._M_allocated_capacity =
         buildOutput.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>(ostr,"\nRun Build Command(s): ",0x17);
    retVal = 0;
    if (makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = &(makeCommand.
                  super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_GeneratedMakeCommand;
      do {
        separator._M_str = " ";
        separator._M_len = 1;
        cmJoin(&local_168,&this_01->PrimaryCommand,separator,(string_view)ZEXT816(0));
        std::__cxx11::string::operator=((string *)&makeCommandStr,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_(&local_168,this_01);
        std::__cxx11::string::operator=((string *)&outputMakeCommandStr,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (this_01 + 1 !=
            &(makeCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand) {
          std::__cxx11::string::append((char *)&makeCommandStr);
          std::__cxx11::string::append((char *)&outputMakeCommandStr);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (ostr,outputMakeCommandStr._M_dataplus._M_p,
                            outputMakeCommandStr._M_string_length);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        bVar5 = cmSystemTools::RunSingleCommand
                          (&this_01->PrimaryCommand,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,
                           local_16c,timeout,Auto);
        if (!bVar5) {
          local_168._M_dataplus._M_p = (pointer)0x37;
          local_168._M_string_length = 0x8169bd;
          local_168.field_2._M_allocated_capacity = 0;
          local_168.field_2._8_8_ = makeCommandStr._M_string_length;
          local_148 = makeCommandStr._M_dataplus._M_p;
          local_140 = 0;
          views_00._M_len = 2;
          views_00._M_array = (iterator)&local_168;
          cmSystemTools::s_RunCommandHideConsole = bVar3;
          cmCatViews(&local_78,views_00);
          cmSystemTools::Error(&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (ostr,outputBuffer._M_dataplus._M_p,outputBuffer._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\nGenerator: execution of make failed. Make command was: ",0x38);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,outputMakeCommandStr._M_dataplus._M_p,
                              outputMakeCommandStr._M_string_length);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          iVar8 = 1;
          goto LAB_00238ff4;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (ostr,outputBuffer._M_dataplus._M_p,outputBuffer._M_string_length);
        std::ostream::flush();
        if (bVar4) {
          std::__cxx11::string::_M_append((char *)&buildOutput,(ulong)outputBuffer._M_dataplus._M_p)
          ;
        }
        this_01 = this_01 + 1;
      } while ((this_01 !=
                &(makeCommand.
                  super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand) &&
              (retVal == 0));
    }
    std::ios::widen((char)ostr->_vptr_basic_ostream[-3] + (char)ostr);
    std::ostream::put((char)ostr);
    std::ostream::flush();
    iVar8 = retVal;
    cmSystemTools::s_RunCommandHideConsole = bVar3;
    if ((bVar4 && retVal == 0) &&
       (lVar7 = std::__cxx11::string::find((char *)&buildOutput,0x8169f5,0), iVar8 = retVal,
       lVar7 != -1)) {
      retVal = 1;
      iVar8 = 1;
    }
LAB_00238ff4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buildOutput._M_dataplus._M_p != &buildOutput.field_2) {
      operator_delete(buildOutput._M_dataplus._M_p,buildOutput.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputMakeCommandStr._M_dataplus._M_p != &outputMakeCommandStr.field_2) {
      operator_delete(outputMakeCommandStr._M_dataplus._M_p,
                      CONCAT71(outputMakeCommandStr.field_2._M_allocated_capacity._1_7_,
                               outputMakeCommandStr.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != &makeCommandStr.field_2) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector(&makeCommand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputBuffer._M_dataplus._M_p != &outputBuffer.field_2) {
    operator_delete(outputBuffer._M_dataplus._M_p,
                    CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                             outputBuffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)realConfig._M_dataplus._M_p != &realConfig.field_2) {
    operator_delete(realConfig._M_dataplus._M_p,realConfig.field_2._M_allocated_capacity + 1);
  }
LAB_002390a8:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar8;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::ostream& ostr, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  ostr << "Change Dir: '" << bindir << '\'' << std::endl;
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    ostr << err << std::endl;
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    ostr << "\nRun Clean Command: " << cleanCommand.front().QuotedPrintable()
         << std::endl;
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      ostr << *outputPtr << "\nGenerator: execution of make clean failed."
           << std::endl;

      return 1;
    }
    ostr << *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  std::string outputMakeCommandStr;
  bool isWatcomWMake = this->CMakeInstance->GetState()->UseWatcomWMake();
  bool needBuildOutput = isWatcomWMake;
  std::string buildOutput;
  ostr << "\nRun Build Command(s): ";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    outputMakeCommandStr = command->QuotedPrintable();
    if ((command + 1) != makeCommand.end()) {
      makeCommandStr += " && ";
      outputMakeCommandStr += " && ";
    }

    ostr << outputMakeCommandStr << std::endl;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        cmStrCat("Generator: execution of make failed. Make command was: ",
                 makeCommandStr));
      ostr << *outputPtr
           << "\nGenerator: execution of make failed. Make command was: "
           << outputMakeCommandStr << std::endl;

      return 1;
    }
    ostr << *outputPtr << std::flush;
    if (needBuildOutput) {
      buildOutput += *outputPtr;
    }
  }
  ostr << std::endl;
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (isWatcomWMake && retVal == 0 &&
      buildOutput.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}